

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle_settings.cpp
# Opt level: O3

ostream * cornelich::operator<<(ostream *os,vanilla_chronicle_settings *s)

{
  undefined8 in_RAX;
  ostream *poVar1;
  double dVar2;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"- path                   = ",0x1b);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(s->m_path)._M_dataplus._M_p,(s->m_path)._M_string_length);
  uStack_38._0_3_ = CONCAT12(10,(undefined2)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_38 + 2),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- cycle_length           = ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s->m_cycle_length);
  uStack_38._0_4_ = CONCAT13(10,(undefined3)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_38 + 3),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- entries_per_cycle      = ",0x1b);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [",2);
  dVar2 = log2((double)s->m_entries_per_cycle);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bits]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- index_block_size       = ",0x1b);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [",2);
  dVar2 = log2((double)s->m_index_block_size);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bits]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- data_block_size        = ",0x1b);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [",2);
  dVar2 = log2((double)s->m_data_block_size);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bits]\n",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- thread_id_bits         = ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s->m_thread_id_bits);
  uStack_38._0_5_ = CONCAT14(10,(undefined4)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_38 + 4),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- thread_id_mask         = 0x",0x1d);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_38 + 5),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- index_data_offset_bits = ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0x40 - s->m_thread_id_bits);
  uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_38 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- index_data_offset_mask = 0x",0x1d);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- index_cache_size       = ",0x1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_38 + 7),1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"- data_cache_size        = ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, const vanilla_chronicle_settings & s)
{
    os << "- path                   = " << s.path() << '\n'
       << "- cycle_length           = " << s.cycle_length() << '\n'
       << "- entries_per_cycle      = " << s.entries_per_cycle() << " [" << std::log2(s.entries_per_cycle()) << " bits]\n"
       << "- index_block_size       = " << s.index_block_size() << " [" << std::log2(s.index_block_size()) << " bits]\n"
       << "- data_block_size        = " << s.data_block_size() << " [" << std::log2(s.data_block_size()) << " bits]\n"
       << "- thread_id_bits         = " << s.thread_id_bits() << '\n'
       << "- thread_id_mask         = 0x" << std::hex << s.thread_id_mask() << std::dec << '\n'
       << "- index_data_offset_bits = " << s.index_data_offset_bits() << '\n'
       << "- index_data_offset_mask = 0x" << std::hex << s.index_data_offset_mask() << std::dec
       << "- index_cache_size       = " << s.index_cache_size() << '\n'
       << "- data_cache_size        = " << s.data_cache_size();
    return os;
}